

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dto.h
# Opt level: O2

string * dto::pretty_payload(string *__return_storage_ptr__,string *pld)

{
  char local_32 [2];
  string short_pld;
  
  std::__cxx11::string::substr((ulong)&short_pld,(ulong)pld);
  local_32[1] = 10;
  local_32[0] = '|';
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )short_pld._M_dataplus._M_p,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(short_pld._M_dataplus._M_p + short_pld._M_string_length),local_32 + 1,local_32);
  if (short_pld._M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&short_pld);
  }
  else {
    std::operator+(__return_storage_ptr__,&short_pld,"...");
  }
  std::__cxx11::string::~string((string *)&short_pld);
  return __return_storage_ptr__;
}

Assistant:

inline std::string pretty_payload(const std::string &pld) {
  std::string short_pld = pld.substr(0, 20);
  std::replace(short_pld.begin(), short_pld.end(), '\n', '|');
  return short_pld.empty() ? short_pld : short_pld + "...";
}